

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

CImg<char> * __thiscall
cimg_library::CImg<char>::get_crop
          (CImg<char> *__return_storage_ptr__,CImg<char> *this,int x0,int y0,int z0,int c0,int x1,
          int y1,int z1,int c1,uint boundary_conditions)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  int iVar7;
  char *pcVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  CImg<char> *this_00;
  CImgInstanceException *this_01;
  int iVar12;
  ulong uVar13;
  int y;
  long lVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  uint uVar20;
  ulong uVar21;
  int x;
  uint uVar22;
  long lVar23;
  uint uVar24;
  long lVar25;
  int z;
  uint uVar26;
  long lVar27;
  char local_81;
  ulong local_80;
  int local_78;
  undefined4 uStack_74;
  int local_70;
  undefined4 uStack_6c;
  int local_68;
  undefined4 uStack_64;
  
  bVar6 = is_empty(this);
  if (!bVar6) {
    uVar24 = x1;
    if (x0 < x1) {
      uVar24 = x0;
    }
    _local_68 = CONCAT44(uStack_64,x0);
    uVar20 = x1 ^ x0 ^ uVar24;
    uVar2 = y1;
    if (y0 < y1) {
      uVar2 = y0;
    }
    _local_70 = CONCAT44(uStack_6c,-uVar2);
    uVar26 = y1 ^ y0 ^ uVar2;
    uVar3 = z1;
    if (z0 < z1) {
      uVar3 = z0;
    }
    _local_78 = CONCAT44(uStack_74,-uVar3);
    uVar22 = z1 ^ z0 ^ uVar3;
    uVar1 = c1;
    if (c0 < c1) {
      uVar1 = c0;
    }
    local_80 = (ulong)uVar1;
    uVar16 = c1 ^ c0 ^ uVar1;
    CImg(__return_storage_ptr__,(uVar20 - uVar24) + 1,(uVar26 - uVar2) + 1,(uVar22 - uVar3) + 1,
         (uVar16 - uVar1) + 1);
    if ((((((int)uVar24 < 0) || ((int)uVar2 < 0)) || ((int)this->_width <= (int)uVar20)) ||
        (((int)uVar3 < 0 || ((int)this->_height <= (int)uVar26)))) ||
       (((int)local_80 < 0 ||
        (((int)this->_depth <= (int)uVar22 || ((int)this->_spectrum <= (int)uVar16)))))) {
      if (boundary_conditions == 3) {
        iVar12 = this->_width * 2;
        iVar7 = this->_height * 2;
        iVar4 = this->_depth * 2;
        iVar5 = this->_spectrum * 2;
        for (lVar25 = 0; lVar25 < (int)__return_storage_ptr__->_spectrum; lVar25 = lVar25 + 1) {
          uVar9 = (int)local_80 + lVar25;
          for (lVar27 = 0; lVar27 < (int)__return_storage_ptr__->_depth; lVar27 = lVar27 + 1) {
            uVar10 = (int)uVar3 + lVar27;
            for (lVar14 = 0; lVar14 < (int)__return_storage_ptr__->_height; lVar14 = lVar14 + 1) {
              uVar11 = (int)uVar2 + lVar14;
              for (lVar23 = 0; lVar23 < (int)__return_storage_ptr__->_width; lVar23 = lVar23 + 1) {
                uVar18 = (int)uVar24 + lVar23;
                uVar17 = (long)((ulong)(uint)((int)uVar18 >> 0x1f) << 0x20 | uVar18 & 0xffffffff) %
                         (long)iVar12;
                uVar21 = (ulong)(uint)((int)uVar17 + iVar12);
                if ((int)uVar17 == 0) {
                  uVar21 = uVar17 & 0xffffffff;
                }
                if (-1 < (long)uVar18) {
                  uVar21 = uVar17 & 0xffffffff;
                }
                uVar18 = (long)((ulong)(uint)((int)uVar11 >> 0x1f) << 0x20 | uVar11 & 0xffffffff) %
                         (long)iVar7;
                uVar17 = (ulong)(uint)((int)uVar18 + iVar7);
                if ((int)uVar18 == 0) {
                  uVar17 = uVar18 & 0xffffffff;
                }
                if (-1 < (long)uVar11) {
                  uVar17 = uVar18 & 0xffffffff;
                }
                uVar26 = (uint)((long)((ulong)(uint)((int)uVar10 >> 0x1f) << 0x20 |
                                      uVar10 & 0xffffffff) % (long)iVar4);
                uVar20 = uVar26 + iVar4;
                if (uVar26 == 0) {
                  uVar20 = uVar26;
                }
                if (-1 < (long)uVar10) {
                  uVar20 = uVar26;
                }
                uVar18 = (long)((ulong)(uint)((int)uVar9 >> 0x1f) << 0x20 | uVar9 & 0xffffffff) %
                         (long)iVar5;
                uVar15 = (ulong)(uint)((int)uVar18 + iVar5);
                if ((int)uVar18 == 0) {
                  uVar15 = uVar18 & 0xffffffff;
                }
                if (-1 < (long)uVar9) {
                  uVar15 = uVar18 & 0xffffffff;
                }
                uVar26 = this->_width;
                uVar18 = (ulong)(~(uint)uVar21 + iVar12);
                if ((int)(uint)uVar21 < (int)uVar26) {
                  uVar18 = uVar21;
                }
                uVar21 = (ulong)(~(uint)uVar17 + iVar7);
                if ((int)(uint)uVar17 < (int)this->_height) {
                  uVar21 = uVar17;
                }
                uVar1 = ~uVar20 + iVar4;
                if ((int)uVar20 < (int)this->_depth) {
                  uVar1 = uVar20;
                }
                uVar17 = (ulong)(~(uint)uVar15 + iVar5);
                if ((int)(uint)uVar15 < (int)this->_spectrum) {
                  uVar17 = uVar15;
                }
                lVar19 = (ulong)this->_height * (ulong)uVar26;
                __return_storage_ptr__->_data
                [lVar23 + (((ulong)__return_storage_ptr__->_depth * lVar25 + lVar27) *
                           (ulong)__return_storage_ptr__->_height + lVar14) *
                          (ulong)__return_storage_ptr__->_width] =
                     this->_data
                     [lVar19 * (ulong)this->_depth * uVar17 +
                      (ulong)uVar1 * lVar19 + uVar18 + uVar21 * uVar26];
              }
            }
          }
        }
      }
      else if (boundary_conditions == 2) {
        for (lVar25 = 0; lVar25 < (int)__return_storage_ptr__->_spectrum; lVar25 = lVar25 + 1) {
          uVar9 = (int)local_80 + lVar25;
          for (lVar27 = 0; lVar27 < (int)__return_storage_ptr__->_depth; lVar27 = lVar27 + 1) {
            uVar10 = (int)uVar3 + lVar27;
            for (lVar14 = 0; lVar14 < (int)__return_storage_ptr__->_height; lVar14 = lVar14 + 1) {
              uVar11 = (int)uVar2 + lVar14;
              for (lVar23 = 0; lVar23 < (int)__return_storage_ptr__->_width; lVar23 = lVar23 + 1) {
                uVar18 = (int)uVar24 + lVar23;
                uVar20 = this->_width;
                uVar26 = this->_height;
                uVar17 = (long)((ulong)(uint)((int)uVar18 >> 0x1f) << 0x20 | uVar18 & 0xffffffff) %
                         (long)(int)uVar20;
                uVar21 = (ulong)((int)uVar17 + uVar20);
                if ((int)uVar17 == 0) {
                  uVar21 = uVar17 & 0xffffffff;
                }
                if (-1 < (long)uVar18) {
                  uVar21 = uVar17 & 0xffffffff;
                }
                uVar18 = (long)((ulong)(uint)((int)uVar11 >> 0x1f) << 0x20 | uVar11 & 0xffffffff) %
                         (long)(int)uVar26;
                uVar17 = (ulong)((int)uVar18 + uVar26);
                if ((int)uVar18 == 0) {
                  uVar17 = uVar18 & 0xffffffff;
                }
                if (-1 < (long)uVar11) {
                  uVar17 = uVar18 & 0xffffffff;
                }
                uVar1 = this->_depth;
                uVar18 = (long)((ulong)(uint)((int)uVar10 >> 0x1f) << 0x20 | uVar10 & 0xffffffff) %
                         (long)(int)uVar1;
                uVar15 = (ulong)((int)uVar18 + uVar1);
                if ((int)uVar18 == 0) {
                  uVar15 = uVar18 & 0xffffffff;
                }
                if (-1 < (long)uVar10) {
                  uVar15 = uVar18 & 0xffffffff;
                }
                uVar18 = (long)((ulong)(uint)((int)uVar9 >> 0x1f) << 0x20 | uVar9 & 0xffffffff) %
                         (long)(int)this->_spectrum;
                uVar13 = (ulong)(this->_spectrum + (int)uVar18);
                if ((int)uVar18 == 0) {
                  uVar13 = uVar18 & 0xffffffff;
                }
                if (-1 < (long)uVar9) {
                  uVar13 = uVar18 & 0xffffffff;
                }
                lVar19 = (ulong)uVar26 * (ulong)uVar20;
                __return_storage_ptr__->_data
                [lVar23 + (((ulong)__return_storage_ptr__->_depth * lVar25 + lVar27) *
                           (ulong)__return_storage_ptr__->_height + lVar14) *
                          (ulong)__return_storage_ptr__->_width] =
                     this->_data
                     [lVar19 * (ulong)uVar1 * uVar13 + uVar15 * lVar19 + uVar21 + uVar17 * uVar20];
              }
            }
          }
        }
      }
      else if (boundary_conditions == 1) {
        iVar12 = local_68;
        if (x1 < local_68) {
          iVar12 = x1;
        }
        for (lVar25 = 0; lVar25 < (int)__return_storage_ptr__->_spectrum; lVar25 = lVar25 + 1) {
          iVar7 = (int)local_80;
          for (lVar27 = 0; lVar27 < (int)__return_storage_ptr__->_depth; lVar27 = lVar27 + 1) {
            for (lVar14 = 0; lVar14 < (int)__return_storage_ptr__->_height; lVar14 = lVar14 + 1) {
              for (lVar23 = 0; lVar23 < (int)__return_storage_ptr__->_width; lVar23 = lVar23 + 1) {
                pcVar8 = _atXYZC(this,iVar12 + (int)lVar23,uVar2 + (int)lVar14,uVar3 + (int)lVar27,
                                 iVar7 + (int)lVar25);
                __return_storage_ptr__->_data
                [lVar23 + (((ulong)__return_storage_ptr__->_depth * lVar25 + lVar27) *
                           (ulong)__return_storage_ptr__->_height + lVar14) *
                          (ulong)__return_storage_ptr__->_width] = *pcVar8;
              }
            }
          }
        }
      }
      else {
        local_81 = '\0';
        this_00 = fill(__return_storage_ptr__,&local_81);
        draw_image(this_00,-uVar24,local_70,local_78,-uVar1,this,1.0);
      }
    }
    else {
      draw_image(__return_storage_ptr__,-uVar24,local_70,local_78,-uVar1,this,1.0);
    }
    return __return_storage_ptr__;
  }
  this_01 = (CImgInstanceException *)__cxa_allocate_exception(0x10);
  pcVar8 = "non-";
  if (this->_is_shared != false) {
    pcVar8 = "";
  }
  CImgInstanceException::CImgInstanceException
            (this_01,"[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::crop(): Empty instance.",
             (ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
             this->_data,pcVar8,"char");
  __cxa_throw(this_01,&CImgInstanceException::typeinfo,CImgException::~CImgException);
}

Assistant:

CImg<T> get_crop(const int x0, const int y0, const int z0, const int c0,
                     const int x1, const int y1, const int z1, const int c1,
                     const unsigned int boundary_conditions=0) const {
      if (is_empty())
        throw CImgInstanceException(_cimg_instance
                                    "crop(): Empty instance.",
                                    cimg_instance);
      const int
        nx0 = x0<x1?x0:x1, nx1 = x0^x1^nx0,
        ny0 = y0<y1?y0:y1, ny1 = y0^y1^ny0,
        nz0 = z0<z1?z0:z1, nz1 = z0^z1^nz0,
        nc0 = c0<c1?c0:c1, nc1 = c0^c1^nc0;
      CImg<T> res(1U + nx1 - nx0,1U + ny1 - ny0,1U + nz1 - nz0,1U + nc1 - nc0);
      if (nx0<0 || nx1>=width() || ny0<0 || ny1>=height() || nz0<0 || nz1>=depth() || nc0<0 || nc1>=spectrum())
        switch (boundary_conditions) {
        case 3 : { // Mirror
          const int w2 = 2*width(), h2 = 2*height(), d2 = 2*depth(), s2 = 2*spectrum();
          cimg_pragma_openmp(parallel for cimg_openmp_collapse(3) cimg_openmp_if(_width>=(cimg_openmp_sizefactor)*16 &&
                                                                     _height*_depth*_spectrum>=4))
          cimg_forXYZC(res,x,y,z,c) {
            const int
              mx = cimg::mod(nx0 + x,w2),
              my = cimg::mod(ny0 + y,h2),
              mz = cimg::mod(nz0 + z,d2),
              mc = cimg::mod(nc0 + c,s2);
            res(x,y,z,c) = (*this)(mx<width()?mx:w2 - mx - 1,
                                   my<height()?my:h2 - my - 1,
                                   mz<depth()?mz:d2 - mz - 1,
                                   mc<spectrum()?mc:s2 - mc - 1);
          }
        } break;
        case 2 : { // Periodic
          cimg_pragma_openmp(parallel for cimg_openmp_collapse(3) cimg_openmp_if(_width>=(cimg_openmp_sizefactor)*16 &&
                                                                     _height*_depth*_spectrum>=4))
          cimg_forXYZC(res,x,y,z,c) {
            res(x,y,z,c) = (*this)(cimg::mod(nx0 + x,width()),cimg::mod(ny0 + y,height()),
                                   cimg::mod(nz0 + z,depth()),cimg::mod(nc0 + c,spectrum()));
          }
        } break;
        case 1 : // Neumann
          cimg_pragma_openmp(parallel for cimg_openmp_collapse(3) cimg_openmp_if(_width>=(cimg_openmp_sizefactor)*16 &&
                                                                     _height*_depth*_spectrum>=4))
          cimg_forXYZC(res,x,y,z,c) res(x,y,z,c) = _atXYZC(nx0 + x,ny0 + y,nz0 + z,nc0 + c);
          break;
        default : // Dirichlet
          res.fill((T)0).draw_image(-nx0,-ny0,-nz0,-nc0,*this);
        }
      else res.draw_image(-nx0,-ny0,-nz0,-nc0,*this);
      return res;
    }